

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

void __thiscall
lest::failure::failure(failure *this,location *where_,text *expr_,text *decomposition_)

{
  pointer pcVar1;
  long *plVar2;
  ulong *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  undefined8 local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  text local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  text local_98;
  location local_78;
  text local_50;
  
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"failed","");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  if (local_f8 == &local_e8) {
    local_d8.field_2._8_4_ = local_e8._8_4_;
    local_d8.field_2._12_4_ = local_e8._12_4_;
  }
  else {
    local_d8._M_dataplus._M_p = (pointer)local_f8;
  }
  local_d8._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_allocated_capacity._0_4_ = local_e8._M_allocated_capacity._0_4_ & 0xffffff00;
  local_78.file._M_dataplus._M_p = (pointer)&local_78.file.field_2;
  pcVar1 = (where_->file)._M_dataplus._M_p;
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + (where_->file)._M_string_length);
  local_78.line = where_->line;
  pcVar1 = (expr_->_M_dataplus)._M_p;
  local_138 = &local_128;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar1,pcVar1 + expr_->_M_string_length);
  std::__cxx11::string::append((char *)&local_138);
  local_b8 = &local_a8;
  if (local_138 == &local_128) {
    local_a8._8_8_ = local_128._8_8_;
  }
  else {
    local_b8 = local_138;
  }
  local_b0 = local_130;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b8,(ulong)(decomposition_->_M_dataplus)._M_p);
  puVar3 = (ulong *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3) {
    local_108._M_allocated_capacity = *puVar3;
    local_108._8_4_ = (undefined4)plVar2[3];
    local_108._12_4_ = *(undefined4 *)((long)plVar2 + 0x1c);
    local_118 = &local_108;
  }
  else {
    local_108._M_allocated_capacity = *puVar3;
    local_118 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar2;
  }
  local_98._M_string_length = plVar2[1];
  *plVar2 = (long)puVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_118 == &local_108) {
    local_98.field_2._8_4_ = local_108._8_4_;
    local_98.field_2._12_4_ = local_108._12_4_;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98._M_dataplus._M_p = (pointer)local_118;
  }
  local_98.field_2._M_allocated_capacity = local_108._M_allocated_capacity;
  local_110 = 0;
  local_108._M_allocated_capacity = local_108._M_allocated_capacity & 0xffffffffffffff00;
  local_138 = &local_128;
  local_118 = &local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
  if (local_138 == &local_128) {
    local_50.field_2._8_8_ = local_128._8_8_;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)local_138;
  }
  local_50._M_string_length = local_130;
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_138 = &local_128;
  message::message(&this->super_message,&local_d8,&local_78,&local_98,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.file._M_dataplus._M_p != &local_78.file.field_2) {
    operator_delete(local_78.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  *(undefined ***)&this->super_message = &PTR__message_00169898;
  return;
}

Assistant:

failure( location where_, text expr_, text decomposition_)
    : message( "failed", where_, expr_ + " for " + decomposition_) {}